

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int buffer_read_fn(spng_ctx *ctx,void *user,void *data,size_t n)

{
  size_t n_local;
  void *data_local;
  void *user_local;
  spng_ctx *ctx_local;
  
  if (ctx->bytes_left < n) {
    ctx_local._4_4_ = -1;
  }
  else {
    ctx->data = ctx->data + ctx->last_read_size;
    ctx->last_read_size = n;
    ctx->bytes_left = ctx->bytes_left - n;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int buffer_read_fn(spng_ctx *ctx, void *user, void *data, size_t n)
{
    if(n > ctx->bytes_left) return SPNG_IO_EOF;

    (void)user;
    (void)data;
    ctx->data = ctx->data + ctx->last_read_size;

    ctx->last_read_size = n;
    ctx->bytes_left -= n;

    return 0;
}